

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.cc
# Opt level: O3

void __thiscall fasttext::QMatrix::QMatrix(QMatrix *this,Matrix *mat,int32_t dsub,bool qnorm)

{
  int64_t iVar1;
  long lVar2;
  int iVar3;
  ProductQuantizer *pPVar4;
  pointer *__ptr;
  
  (this->pq_)._M_t.
  super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  ._M_t.
  super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
  .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl = (ProductQuantizer *)0x0
  ;
  (this->npq_)._M_t.
  super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  ._M_t.
  super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
  .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl = (ProductQuantizer *)0x0
  ;
  (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->norm_codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->qnorm_ = qnorm;
  iVar1 = mat->m_;
  this->m_ = iVar1;
  lVar2 = mat->n_;
  this->n_ = lVar2;
  iVar3 = (int)(((long)dsub + -1 + lVar2) / (long)dsub) * (int)iVar1;
  this->codesize_ = iVar3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->codes_,(long)iVar3);
  pPVar4 = (ProductQuantizer *)operator_new(0x50);
  ProductQuantizer::ProductQuantizer(pPVar4,(int32_t)this->n_,dsub);
  std::__uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  ::reset((__uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
           *)this,pPVar4);
  if (this->qnorm_ == true) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->norm_codes_,this->m_);
    pPVar4 = (ProductQuantizer *)operator_new(0x50);
    ProductQuantizer::ProductQuantizer(pPVar4,1,1);
    std::
    __uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    reset((__uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
           *)&this->npq_,pPVar4);
  }
  quantize(this,mat);
  return;
}

Assistant:

QMatrix::QMatrix(const Matrix& mat, int32_t dsub, bool qnorm)
    : qnorm_(qnorm),
      m_(mat.size(0)),
      n_(mat.size(1)),
      codesize_(m_ * ((n_ + dsub - 1) / dsub)) {
  codes_.resize(codesize_);
  pq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer(n_, dsub));
  if (qnorm_) {
    norm_codes_.resize(m_);
    npq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer(1, 1));
  }
  quantize(mat);
}